

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O3

void __thiscall
wallet::CWallet::LoadActiveScriptPubKeyMan(CWallet *this,uint256 id,OutputType type,bool internal)

{
  _Rb_tree_header *p_Var1;
  long lVar2;
  pointer pcVar3;
  ScriptPubKeyMan *pSVar4;
  map<OutputType,_wallet::ScriptPubKeyMan_*,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_wallet::ScriptPubKeyMan_*>_>_>
  *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> parameters;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> parameters_1;
  string *psVar5;
  mapped_type *pmVar6;
  mapped_type *ppSVar7;
  _Base_ptr p_Var8;
  _Base_ptr p_Var9;
  map<OutputType,_wallet::ScriptPubKeyMan_*,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_wallet::ScriptPubKeyMan_*>_>_>
  *this_01;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_iterator<std::pair<const_OutputType,_wallet::ScriptPubKeyMan_*>_>,_std::_Rb_tree_iterator<std::pair<const_OutputType,_wallet::ScriptPubKeyMan_*>_>_>
  pVar10;
  undefined3 in_stack_ffffffffffffff88;
  uint uVar11;
  undefined1 *puVar12;
  undefined8 in_stack_ffffffffffffff98;
  long in_stack_ffffffffffffffa0;
  undefined8 in_stack_ffffffffffffffa8;
  _Alloc_hider in_stack_ffffffffffffffb0;
  size_type in_stack_ffffffffffffffb8;
  undefined8 in_stack_ffffffffffffffc0;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  uVar11 = CONCAT13((char)((this->m_wallet_flags).super___atomic_base<unsigned_long>._M_i >> 0x22),
                    in_stack_ffffffffffffff88) & 0x1ffffff;
  inline_assertion_check<true,bool>
            ((bool *)&stack0xffffffffffffff8b,
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.cpp"
             ,0xeef,"LoadActiveScriptPubKeyMan","IsWalletFlagSet(WALLET_FLAG_DESCRIPTORS)");
  base_blob<256u>::ToString_abi_cxx11_((string *)&stack0xffffffffffffffb0,&id);
  psVar5 = FormatOutputType_abi_cxx11_(type);
  pcVar3 = (psVar5->_M_dataplus)._M_p;
  puVar12 = &stack0xffffffffffffffa0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&stack0xffffffffffffff90,pcVar3,pcVar3 + psVar5->_M_string_length);
  parameters._M_dataplus._M_p._4_4_ = type;
  parameters._M_dataplus._M_p._0_4_ = uVar11;
  parameters._M_string_length = (size_type)puVar12;
  parameters.field_2._M_allocated_capacity = in_stack_ffffffffffffff98;
  parameters.field_2._8_8_ = in_stack_ffffffffffffffa0;
  parameters_1._M_string_length = (size_type)in_stack_ffffffffffffffb0._M_p;
  parameters_1._M_dataplus._M_p = (pointer)in_stack_ffffffffffffffa8;
  parameters_1.field_2._M_allocated_capacity = in_stack_ffffffffffffffb8;
  parameters_1.field_2._8_8_ = in_stack_ffffffffffffffc0;
  WalletLogPrintf<std::__cxx11::string,std::__cxx11::string,char_const*>
            (this,"Setting spkMan to active: id = %s, type = %s, internal = %s\n",parameters,
             parameters_1,&stack0xffffffffffffffb0);
  if (puVar12 != &stack0xffffffffffffffa0) {
    operator_delete(puVar12,in_stack_ffffffffffffffa0 + 1);
  }
  if (in_stack_ffffffffffffffb0._M_p != &stack0xffffffffffffffc0) {
    operator_delete(in_stack_ffffffffffffffb0._M_p,in_stack_ffffffffffffffc0 + 1);
  }
  this_01 = &this->m_internal_spk_managers;
  this_00 = &this->m_external_spk_managers;
  if (internal) {
    this_01 = &this->m_external_spk_managers;
    this_00 = &this->m_internal_spk_managers;
  }
  pmVar6 = std::
           map<uint256,_std::unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>_>_>_>
           ::at(&this->m_spk_managers,&id);
  pSVar4 = (pmVar6->_M_t).
           super___uniq_ptr_impl<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>
           ._M_t.
           super__Tuple_impl<0UL,_wallet::ScriptPubKeyMan_*,_std::default_delete<wallet::ScriptPubKeyMan>_>
           .super__Head_base<0UL,_wallet::ScriptPubKeyMan_*,_false>._M_head_impl;
  ppSVar7 = std::
            map<OutputType,_wallet::ScriptPubKeyMan_*,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_wallet::ScriptPubKeyMan_*>_>_>
            ::operator[](this_00,(key_type *)&stack0xffffffffffffff8c);
  *ppSVar7 = pSVar4;
  p_Var9 = (this_01->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var9 != (_Base_ptr)0x0) {
    p_Var1 = &(this_01->_M_t)._M_impl.super__Rb_tree_header;
    p_Var8 = &p_Var1->_M_header;
    do {
      if ((int)type <= (int)p_Var9[1]._M_color) {
        p_Var8 = p_Var9;
      }
      p_Var9 = (&p_Var9->_M_left)[(int)p_Var9[1]._M_color < (int)type];
    } while (p_Var9 != (_Base_ptr)0x0);
    if ((((_Rb_tree_header *)p_Var8 != p_Var1) && ((int)p_Var8[1]._M_color <= (int)type)) &&
       ((ScriptPubKeyMan *)p_Var8[1]._M_parent == pSVar4)) {
      pVar10 = std::
               _Rb_tree<OutputType,_std::pair<const_OutputType,_wallet::ScriptPubKeyMan_*>,_std::_Select1st<std::pair<const_OutputType,_wallet::ScriptPubKeyMan_*>_>,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_wallet::ScriptPubKeyMan_*>_>_>
               ::equal_range(&this_01->_M_t,(key_type *)&stack0xffffffffffffff8c);
      std::
      _Rb_tree<OutputType,_std::pair<const_OutputType,_wallet::ScriptPubKeyMan_*>,_std::_Select1st<std::pair<const_OutputType,_wallet::ScriptPubKeyMan_*>_>,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_wallet::ScriptPubKeyMan_*>_>_>
      ::_M_erase_aux(&this_01->_M_t,(_Base_ptr)pVar10.first._M_node,(_Base_ptr)pVar10.second._M_node
                    );
    }
  }
  boost::signals2::
  signal<void_(),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_()>,_boost::function<void_(const_boost::signals2::connection_&)>,_boost::signals2::mutex>
  ::operator()(&this->NotifyCanGetAddressesChanged);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CWallet::LoadActiveScriptPubKeyMan(uint256 id, OutputType type, bool internal)
{
    // Activating ScriptPubKeyManager for a given output and change type is incompatible with legacy wallets.
    // Legacy wallets have only one ScriptPubKeyManager and it's active for all output and change types.
    Assert(IsWalletFlagSet(WALLET_FLAG_DESCRIPTORS));

    WalletLogPrintf("Setting spkMan to active: id = %s, type = %s, internal = %s\n", id.ToString(), FormatOutputType(type), internal ? "true" : "false");
    auto& spk_mans = internal ? m_internal_spk_managers : m_external_spk_managers;
    auto& spk_mans_other = internal ? m_external_spk_managers : m_internal_spk_managers;
    auto spk_man = m_spk_managers.at(id).get();
    spk_mans[type] = spk_man;

    const auto it = spk_mans_other.find(type);
    if (it != spk_mans_other.end() && it->second == spk_man) {
        spk_mans_other.erase(type);
    }

    NotifyCanGetAddressesChanged();
}